

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jama_lu.h
# Opt level: O0

Array2D<double> * __thiscall
JAMA::LU<double>::permute_copy
          (Array2D<double> *__return_storage_ptr__,LU<double> *this,Array2D<double> *A,
          Array1D<int> *piv,int j0,int j1)

{
  double dVar1;
  int m;
  int *piVar2;
  double *pdVar3;
  int local_40;
  int local_3c;
  int j;
  int i;
  int piv_length;
  int j1_local;
  int j0_local;
  Array1D<int> *piv_local;
  Array2D<double> *A_local;
  LU<double> *this_local;
  Array2D<double> *X;
  
  m = TNT::Array1D<int>::dim(piv);
  TNT::Array2D<double>::Array2D(__return_storage_ptr__,m,(j1 - j0) + 1);
  for (local_3c = 0; local_40 = j0, local_3c < m; local_3c = local_3c + 1) {
    for (; local_40 <= j1; local_40 = local_40 + 1) {
      piVar2 = TNT::Array1D<int>::operator[](piv,local_3c);
      pdVar3 = TNT::Array2D<double>::operator[](A,*piVar2);
      dVar1 = pdVar3[local_40];
      pdVar3 = TNT::Array2D<double>::operator[](__return_storage_ptr__,local_3c);
      pdVar3[local_40 - j0] = dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<Real> permute_copy(const Array2D<Real> &A, 
   			const Array1D<int> &piv, int j0, int j1)
	{
		int piv_length = piv.dim();

		Array2D<Real> X(piv_length, j1-j0+1);


         for (int i = 0; i < piv_length; i++) 
            for (int j = j0; j <= j1; j++) 
               X[i][j-j0] = A[piv[i]][j];

		return X;
	}